

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BOOL __thiscall
Js::DebugDocument::GetStatementLocation(DebugDocument *this,int32 ibos,StatementLocation *plocation)

{
  code *pcVar1;
  anon_class_32_4_96af0bde_for_mapper mapper;
  Interval IVar2;
  Interval IVar3;
  Interval IVar4;
  Interval IVar5;
  Interval IVar6;
  bool bVar7;
  uint uVar8;
  charcount_t cVar9;
  int iVar10;
  uint uVar11;
  BOOL BVar12;
  BOOL BVar13;
  ScriptContext *pSVar14;
  undefined4 *puVar15;
  Interval *local_c0;
  BOOL fNextHasLineBreak;
  Interval local_98;
  Interval func2Range;
  Interval func1Range;
  Interval local_68;
  StatementLocation candidateMatch2;
  StatementLocation candidateMatch1;
  uint32 ubos;
  ScriptContext *scriptContext;
  StatementLocation *plocation_local;
  DebugDocument *pDStack_18;
  int32 ibos_local;
  DebugDocument *this_local;
  
  if (ibos < 0) {
    this_local._4_4_ = 0;
  }
  else {
    plocation_local._4_4_ = ibos;
    pDStack_18 = this;
    pSVar14 = Utf8SourceInfo::GetScriptContext(this->utf8SourceInfo);
    if ((pSVar14 == (ScriptContext *)0x0) ||
       (uVar8 = (*(pSVar14->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(),
       (uVar8 & 1) != 0)) {
      this_local._4_4_ = 0;
    }
    else {
      candidateMatch1.bytecodeSpan.end = plocation_local._4_4_;
      candidateMatch2.bytecodeSpan.begin = 0;
      candidateMatch2.bytecodeSpan.end = 0;
      regex::Interval::Interval((Interval *)&candidateMatch1);
      regex::Interval::Interval(&candidateMatch1.statement);
      local_68.begin = 0;
      local_68.end = 0;
      regex::Interval::Interval((Interval *)&candidateMatch2);
      regex::Interval::Interval(&candidateMatch2.statement);
      mapper.ubos = (uint32 *)&candidateMatch1.bytecodeSpan.end;
      mapper.candidateMatch1 = (StatementLocation *)&candidateMatch2.bytecodeSpan;
      mapper.candidateMatch2 = (StatementLocation *)&local_68;
      mapper.ibos = (int32 *)((long)&plocation_local + 4);
      Utf8SourceInfo::
      MapFunction<Js::DebugDocument::GetStatementLocation(int,Js::StatementLocation*)::__0>
                (this->utf8SourceInfo,mapper);
      if ((candidateMatch2.bytecodeSpan == (Interval)0x0) && (local_68 == (Interval)0x0)) {
        this_local._4_4_ = 0;
      }
      else if ((candidateMatch2.bytecodeSpan == (Interval)0x0) || (local_68 == (Interval)0x0)) {
        if (candidateMatch2.bytecodeSpan == (Interval)0x0) {
          local_c0 = &local_68;
        }
        else {
          local_c0 = &candidateMatch2.bytecodeSpan;
        }
        plocation->function = (FunctionBody *)*local_c0;
        plocation->statement = local_c0[1];
        plocation->bytecodeSpan = local_c0[2];
        this_local._4_4_ = 1;
      }
      else {
        if (candidateMatch2.bytecodeSpan != local_68) {
          if ((candidateMatch2.bytecodeSpan == (Interval)0x0) || (local_68 == (Interval)0x0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar15 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                        ,0x12f,
                                        "(candidateMatch1.function && candidateMatch2.function)",
                                        "candidateMatch1.function && candidateMatch2.function");
            if (!bVar7) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar15 = 0;
          }
          cVar9 = ParseableFunctionInfo::StartInDocument
                            ((ParseableFunctionInfo *)candidateMatch2.bytecodeSpan);
          regex::Interval::Interval(&func2Range,cVar9);
          iVar10 = regex::Interval::Begin(&func2Range);
          uVar11 = ParseableFunctionInfo::LengthInBytes
                             ((ParseableFunctionInfo *)candidateMatch2.bytecodeSpan);
          regex::Interval::End(&func2Range,iVar10 + uVar11);
          cVar9 = ParseableFunctionInfo::StartInDocument((ParseableFunctionInfo *)local_68);
          regex::Interval::Interval(&local_98,cVar9);
          iVar10 = regex::Interval::Begin(&local_98);
          uVar11 = ParseableFunctionInfo::LengthInBytes((ParseableFunctionInfo *)local_68);
          regex::Interval::End(&local_98,iVar10 + uVar11);
          bVar7 = regex::Interval::Includes(&func2Range,local_98);
          if (((bVar7) &&
              (bVar7 = regex::Interval::Includes(&local_98,plocation_local._4_4_), bVar7)) &&
             (iVar10 = regex::Interval::End(&local_98), iVar10 != plocation_local._4_4_)) {
            plocation->function = (FunctionBody *)local_68;
            IVar2.end = candidateMatch2.function._4_4_;
            IVar2.begin = (Type)candidateMatch2.function;
            plocation->statement = IVar2;
            plocation->bytecodeSpan = candidateMatch2.statement;
            return 1;
          }
          bVar7 = regex::Interval::Includes(&local_98,func2Range);
          if (((bVar7) &&
              (bVar7 = regex::Interval::Includes(&func2Range,plocation_local._4_4_), bVar7)) &&
             (iVar10 = regex::Interval::End(&func2Range), iVar10 != plocation_local._4_4_)) {
            plocation->function = (FunctionBody *)candidateMatch2.bytecodeSpan;
            IVar5.end = candidateMatch1.function._4_4_;
            IVar5.begin = (Type)candidateMatch1.function;
            plocation->statement = IVar5;
            plocation->bytecodeSpan = candidateMatch1.statement;
            return 1;
          }
        }
        if ((Type)candidateMatch2.function <= (Type)candidateMatch1.function) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                      ,0x147,
                                      "(candidateMatch1.statement.begin < candidateMatch2.statement.begin)"
                                      ,
                                      "candidateMatch1.statement.begin < candidateMatch2.statement.begin"
                                     );
          if (!bVar7) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 0;
        }
        if (plocation_local._4_4_ <= (Type)candidateMatch1.function) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                      ,0x148,"(candidateMatch1.statement.begin < ibos)",
                                      "candidateMatch1.statement.begin < ibos");
          if (!bVar7) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 0;
        }
        if ((Type)candidateMatch2.function < plocation_local._4_4_) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                      ,0x149,"(candidateMatch2.statement.begin >= ibos)",
                                      "candidateMatch2.statement.begin >= ibos");
          if (!bVar7) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 0;
        }
        plocation->function = (FunctionBody *)candidateMatch2.bytecodeSpan;
        IVar6.end = candidateMatch1.function._4_4_;
        IVar6.begin = (Type)candidateMatch1.function;
        plocation->statement = IVar6;
        plocation->bytecodeSpan = candidateMatch1.statement;
        BVar12 = HasLineBreak(this,plocation_local._4_4_,(Type)candidateMatch2.function);
        if (((Type)candidateMatch2.function == plocation_local._4_4_) ||
           ((BVar13 = HasLineBreak(this,(Type)candidateMatch1.function,plocation_local._4_4_),
            BVar13 != 0 && (BVar12 == 0)))) {
          plocation->function = (FunctionBody *)local_68;
          IVar3.end = candidateMatch2.function._4_4_;
          IVar3.begin = (Type)candidateMatch2.function;
          plocation->statement = IVar3;
          plocation->bytecodeSpan = candidateMatch2.statement;
        }
        else if ((candidateMatch1.function._4_4_ < plocation_local._4_4_) &&
                ((BVar12 == 0 ||
                 (BVar12 = HasLineBreak(this,candidateMatch1.function._4_4_,plocation_local._4_4_),
                 BVar12 != 0)))) {
          plocation->function = (FunctionBody *)local_68;
          IVar4.end = candidateMatch2.function._4_4_;
          IVar4.begin = (Type)candidateMatch2.function;
          plocation->statement = IVar4;
          plocation->bytecodeSpan = candidateMatch2.statement;
        }
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL DebugDocument::GetStatementLocation(int32 ibos, StatementLocation* plocation)
    {
        if (ibos < 0)
        {
            return FALSE;
        }

        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return FALSE;
        }

        uint32 ubos = static_cast<uint32>(ibos);

        // Getting the appropriate statement on the asked position works on the heuristic which requires two
        // probable candidates. These candidates will be closest to the ibos where first.range.start < ibos and
        // second.range.start >= ibos. They will be fetched out by going into each FunctionBody.

        StatementLocation candidateMatch1 = {};
        StatementLocation candidateMatch2 = {};

        this->utf8SourceInfo->MapFunction([&](FunctionBody* pFuncBody)
        {
            uint32 functionStart = pFuncBody->StartInDocument();
            uint32 functionEnd = functionStart + pFuncBody->LengthInBytes();

            // For the first candidate, we should allow the current function to participate if its range
            // (instead of just start offset) is closer to the ubos compared to already found candidate1.

            if (candidateMatch1.function == nullptr ||
                ((candidateMatch1.statement.begin <= static_cast<int>(functionStart) ||
                candidateMatch1.statement.end <= static_cast<int>(functionEnd)) &&
                ubos > functionStart) ||
                candidateMatch2.function == nullptr ||
                (candidateMatch2.statement.begin > static_cast<int>(functionStart) &&
                ubos <= functionStart) ||
                (functionStart <= ubos &&
                ubos < functionEnd))
            {
                // We need to find out two possible candidate from the current FunctionBody.
                pFuncBody->FindClosestStatements(ibos, &candidateMatch1, &candidateMatch2);
            }
        });

        if (candidateMatch1.function == nullptr && candidateMatch2.function == nullptr)
        {
            return FALSE; // No Match found
        }

        if (candidateMatch1.function == nullptr || candidateMatch2.function == nullptr)
        {
            *plocation = (candidateMatch1.function == nullptr) ? candidateMatch2 : candidateMatch1;

            return TRUE;
        }

        // If one of the func is inner to another one, and ibos is in the inner one, disregard the outer one/let the inner one win.
        // See WinBlue 575634. Scenario is like this: var foo = function () {this;} -- and BP is set to 'this;' 'function'.
        if (candidateMatch1.function != candidateMatch2.function)
        {
            Assert(candidateMatch1.function && candidateMatch2.function);

            regex::Interval func1Range(candidateMatch1.function->StartInDocument());
            func1Range.End(func1Range.Begin() + candidateMatch1.function->LengthInBytes());
            regex::Interval func2Range(candidateMatch2.function->StartInDocument());
            func2Range.End(func2Range.Begin() + candidateMatch2.function->LengthInBytes());

            // If cursor (ibos) is just after the closing braces of the inner function then we can't
            // directly choose inner function and have to make line break check, so fallback
            // function foo(){function bar(){var y=1;}#var x=1;bar();}foo(); - ibos is #
            if (func1Range.Includes(func2Range) && func2Range.Includes(ibos) && func2Range.End() != ibos)
            {
                *plocation = candidateMatch2;
                return TRUE;
            }
            else if (func2Range.Includes(func1Range) && func1Range.Includes(ibos) && func1Range.End() != ibos)
            {
                *plocation = candidateMatch1;
                return TRUE;
            }
        }

        // At this point we have both candidate to consider.

        Assert(candidateMatch1.statement.begin < candidateMatch2.statement.begin);
        Assert(candidateMatch1.statement.begin < ibos);
        Assert(candidateMatch2.statement.begin >= ibos);

        // Default selection
        *plocation = candidateMatch1;

        // If the second candidate start at ibos or
        // if the first candidate has line break between ibos and the second candidate is on the same line as ibos
        // then consider the second one.

        BOOL fNextHasLineBreak = this->HasLineBreak(ibos, candidateMatch2.statement.begin);

        if ((candidateMatch2.statement.begin == ibos)
            || (this->HasLineBreak(candidateMatch1.statement.begin, ibos) && !fNextHasLineBreak))
        {
            *plocation = candidateMatch2;
        }
        // If ibos is out of the range of first candidate, choose second candidate if  ibos is on the same line as second candidate
        // or ibos is not on the same line of the end of the first candidate.
        else if (candidateMatch1.statement.end < ibos && (!fNextHasLineBreak || this->HasLineBreak(candidateMatch1.statement.end, ibos)))
        {
            *plocation = candidateMatch2;
        }

        return TRUE;
    }